

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_arc.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::arc(Fl_Graphics_Driver *this,double x,double y,double r,double start,double end)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double Xnew;
  double sin_e;
  double cos_e;
  int i;
  double r2;
  double r1;
  double epsilon;
  double Y;
  double X;
  double A;
  double end_local;
  double start_local;
  double r_local;
  double y_local;
  double x_local;
  Fl_Graphics_Driver *this_local;
  
  dVar1 = start * 0.017453292519943295;
  dVar2 = cos(dVar1);
  dVar3 = sin(dVar1);
  epsilon = -r * dVar3;
  fl_vertex(x + r * dVar2,y + epsilon);
  dVar3 = fl_transform_dx(r,0.0);
  dVar4 = fl_transform_dy(r,0.0);
  r2 = _fl_hypot(dVar3,dVar4);
  dVar3 = fl_transform_dx(0.0,r);
  dVar4 = fl_transform_dy(0.0,r);
  dVar3 = _fl_hypot(dVar3,dVar4);
  if (dVar3 < r2) {
    r2 = dVar3;
  }
  if (r2 < 2.0) {
    r2 = 2.0;
  }
  dVar3 = acos(1.0 - 0.125 / r2);
  dVar4 = end * 0.017453292519943295 + -dVar1;
  dVar1 = ceil(ABS(dVar4) / (dVar3 * 2.0));
  cos_e._4_4_ = (int)dVar1;
  if (cos_e._4_4_ != 0) {
    dVar4 = dVar4 / (double)cos_e._4_4_;
    dVar1 = cos(dVar4);
    dVar3 = sin(dVar4);
    Y = r * dVar2;
    do {
      dVar2 = dVar1 * Y + dVar3 * epsilon;
      epsilon = -dVar3 * Y + dVar1 * epsilon;
      fl_vertex(x + dVar2,y + epsilon);
      cos_e._4_4_ = cos_e._4_4_ + -1;
      Y = dVar2;
    } while (cos_e._4_4_ != 0);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::arc(double x, double y, double r, double start, double end) {

  // draw start point accurately:
  
  double A = start*(M_PI/180);		// Initial angle (radians)
  double X =  r*cos(A);			// Initial displacement, (X,Y)
  double Y = -r*sin(A);			//   from center to initial point
  fl_vertex(x+X,y+Y);			// Insert initial point

  // Maximum arc length to approximate with chord with error <= 0.125
  
  double epsilon; {
    double r1 = _fl_hypot(fl_transform_dx(r,0), // Horizontal "radius"
		          fl_transform_dy(r,0));
    double r2 = _fl_hypot(fl_transform_dx(0,r), // Vertical "radius"
		          fl_transform_dy(0,r));
		      
    if (r1 > r2) r1 = r2;		// r1 = minimum "radius"
    if (r1 < 2.) r1 = 2.;		// radius for circa 9 chords/circle
    
    epsilon = 2*acos(1.0 - 0.125/r1);	// Maximum arc angle
  }
  A = end*(M_PI/180) - A;		// Displacement angle (radians)
  int i = int(ceil(fabs(A)/epsilon));	// Segments in approximation
  
  if (i) {
    epsilon = A/i;			// Arc length for equal-size steps
    double cos_e = cos(epsilon);	// Rotation coefficients
    double sin_e = sin(epsilon);
    do {
      double Xnew =  cos_e*X + sin_e*Y;
		Y = -sin_e*X + cos_e*Y;
      fl_vertex(x + (X=Xnew), y + Y);
    } while (--i);
  }
}